

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_test.cpp
# Opt level: O3

void __thiscall shared_ptr_compare_ptr_Test::TestBody(shared_ptr_compare_ptr_Test *this)

{
  Struct *pSVar1;
  bool bVar2;
  AssertHelperData *pAVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  AssertionResult gtest_ar_26;
  Struct *pZ;
  AssertionResult gtest_ar_6;
  Struct *pX;
  AssertionResult gtest_ar;
  AssertHelper AStack_78;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  shared_ptr<Struct> local_50;
  AssertHelperData *local_40;
  shared_ptr<Struct> local_38;
  shared_ptr<Struct> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar3 = (AssertHelperData *)operator_new(4);
  Struct::_mNbInstances = Struct::_mNbInstances + 1;
  pAVar3->type = 0x7b;
  local_28.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  shared_ptr_count::acquire<Struct>((shared_ptr_count *)&local_28,(Struct *)pAVar3);
  local_50.super_shared_ptr_base.pn.pn._0_1_ = 1;
  local_28.px = (Struct *)pAVar3;
  testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
            ((internal *)&local_38,"true","xPtr",(bool *)&local_50,&local_28);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)&(local_38.px)->mVal;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x134,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_50.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_50.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_50.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.super_shared_ptr_base.pn.pn._0_1_ = 1;
  if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = *(long *)local_28.super_shared_ptr_base.pn.pn == 1;
  }
  local_68.data_._0_1_ = (internal)bVar2;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_38,"true","xPtr.unique()",(bool *)&local_50,(bool *)&local_68);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)&(local_38.px)->mVal;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x135,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_50.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_50.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_50.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.data_._0_4_ = 1;
  if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_50.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  }
  else {
    local_50.super_shared_ptr_base.pn.pn = *(shared_ptr_count *)local_28.super_shared_ptr_base.pn.pn
    ;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_38,"1","xPtr.use_count()",(int *)&local_68,(long *)&local_50);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)&(local_38.px)->mVal;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x136,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_50.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_50.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_50.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  local_68.data_ = (AssertHelperData *)local_28.px;
  testing::internal::CmpHelperNE<void*,Struct*>
            ((internal *)&local_38,"(void*)__null","xPtr.get()",(void **)&local_50,
             (Struct **)&local_68);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)&(local_38.px)->mVal;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x137,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_50.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_50.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_50.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.super_shared_ptr_base.pn.pn._0_4_ = 0x7b;
  if ((AssertHelperData *)local_28.px != (AssertHelperData *)0x0) {
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_38,"123","xPtr->mVal",(int *)&local_50,&(local_28.px)->mVal);
    if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&local_50);
      if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)&(local_38.px)->mVal;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x138,pcVar4);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_50.super_shared_ptr_base.pn.pn != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_50.super_shared_ptr_base.pn.pn != (long *)0x0)) {
          (**(code **)(*(long *)local_50.super_shared_ptr_base.pn.pn + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_50.super_shared_ptr_base.pn.pn._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_38,"1","Struct::_mNbInstances",(int *)&local_50,
               &Struct::_mNbInstances);
    if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&local_50);
      if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)&(local_38.px)->mVal;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x139,pcVar4);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_50.super_shared_ptr_base.pn.pn != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_50.super_shared_ptr_base.pn.pn != (long *)0x0)) {
          (**(code **)(*(long *)local_50.super_shared_ptr_base.pn.pn + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40 = (AssertHelperData *)local_28.px;
    pAVar3 = (AssertHelperData *)operator_new(4);
    Struct::_mNbInstances = Struct::_mNbInstances + 1;
    pAVar3->type = 0xea;
    local_38.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    shared_ptr_count::acquire<Struct>((shared_ptr_count *)&local_38,(Struct *)pAVar3);
    local_68.data_._0_1_ = (internal)0x1;
    local_38.px = (Struct *)pAVar3;
    testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
              ((internal *)&local_50,"true","xPtr",(bool *)&local_68,&local_28);
    if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&local_68);
      if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)&(local_50.px)->mVal;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x13f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_68.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_68.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_68.data_._0_1_ = (internal)0x1;
    if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = *(long *)local_28.super_shared_ptr_base.pn.pn == 1;
    }
    local_58.data_._0_1_ = bVar2;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_50,"true","xPtr.unique()",(bool *)&local_68,(bool *)&local_58);
    if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&local_68);
      if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)&(local_50.px)->mVal;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x140,pcVar4);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_68.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_68.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_58.data_._0_4_ = 1;
    if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
      local_68.data_ = (AssertHelperData *)0x0;
    }
    else {
      local_68.data_ = *(AssertHelperData **)local_28.super_shared_ptr_base.pn.pn;
    }
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&local_50,"1","xPtr.use_count()",(int *)&local_58,(long *)&local_68);
    if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&local_68);
      if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)&(local_50.px)->mVal;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x141,pcVar4);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_68.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_68.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_68.data_ = (AssertHelperData *)0x0;
    local_58.data_ = (AssertHelperData *)local_28.px;
    testing::internal::CmpHelperNE<void*,Struct*>
              ((internal *)&local_50,"(void*)__null","xPtr.get()",&local_68.data_,
               (Struct **)&local_58);
    if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&local_68);
      if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)&(local_50.px)->mVal;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x142,pcVar4);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_68.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_68.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_68.data_._0_4_ = 0x7b;
    if ((AssertHelperData *)local_28.px != (AssertHelperData *)0x0) {
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_50,"123","xPtr->mVal",(int *)&local_68,&(local_28.px)->mVal);
      if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)&(local_50.px)->mVal;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                   ,0x143,pcVar4);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_68.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_68.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_50.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
      local_68.data_._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_50,"2","Struct::_mNbInstances",(int *)&local_68,
                 &Struct::_mNbInstances);
      if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)&(local_50.px)->mVal;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                   ,0x144,pcVar4);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_68.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_68.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_50.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
      local_68.data_._0_1_ = (internal)0x1;
      testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
                ((internal *)&local_50,"true","yPtr",(bool *)&local_68,&local_38);
      if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)&(local_50.px)->mVal;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                   ,0x146,pcVar4);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_68.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_68.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_50.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
      local_68.data_._0_1_ = (internal)0x1;
      if (local_38.super_shared_ptr_base.pn.pn == (long *)0x0) {
        bVar2 = false;
      }
      else {
        bVar2 = *(long *)local_38.super_shared_ptr_base.pn.pn == 1;
      }
      local_58.data_._0_1_ = bVar2;
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)&local_50,"true","yPtr.unique()",(bool *)&local_68,(bool *)&local_58);
      if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)&(local_50.px)->mVal;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                   ,0x147,pcVar4);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_68.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_68.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_50.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
      local_58.data_._0_4_ = 1;
      if (local_38.super_shared_ptr_base.pn.pn == (long *)0x0) {
        local_68.data_ = (AssertHelperData *)0x0;
      }
      else {
        local_68.data_ = *(AssertHelperData **)local_38.super_shared_ptr_base.pn.pn;
      }
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&local_50,"1","yPtr.use_count()",(int *)&local_58,(long *)&local_68);
      if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)&(local_50.px)->mVal;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                   ,0x148,pcVar4);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_68.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_68.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_50.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
      local_68.data_ = (AssertHelperData *)0x0;
      local_58.data_ = (AssertHelperData *)local_38.px;
      testing::internal::CmpHelperNE<void*,Struct*>
                ((internal *)&local_50,"(void*)__null","yPtr.get()",&local_68.data_,
                 (Struct **)&local_58);
      if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)&(local_50.px)->mVal;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                   ,0x149,pcVar4);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_68.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_68.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_50.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
      local_68.data_._0_4_ = 0xea;
      if ((AssertHelperData *)local_38.px != (AssertHelperData *)0x0) {
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_50,"234","yPtr->mVal",(int *)&local_68,&(local_38.px)->mVal);
        if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
          testing::Message::Message((Message *)&local_68);
          if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)&(local_50.px)->mVal;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                     ,0x14a,pcVar4);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if (local_68.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_68.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_50.px,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pSVar1 = local_38.px;
        testing::internal::CmpHelperNE<shared_ptr<Struct>,shared_ptr<Struct>>
                  ((internal *)&local_50,"xPtr","yPtr",&local_28,&local_38);
        if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
          testing::Message::Message((Message *)&local_68);
          if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)&(local_50.px)->mVal;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                     ,0x14d,pcVar4);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if (local_68.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_68.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_50.px,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (local_40 < pSVar1) {
          testing::internal::CmpHelperLT<shared_ptr<Struct>,shared_ptr<Struct>>
                    ((internal *)&local_50,"xPtr","yPtr",&local_28,&local_38);
          if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
            testing::Message::Message((Message *)&local_68);
            if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)&(local_50.px)->mVal;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                       ,0x150,pcVar4);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_58);
            if (local_68.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_68.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50.px,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          testing::internal::CmpHelperLE<shared_ptr<Struct>,shared_ptr<Struct>>
                    ((internal *)&local_50,"xPtr","yPtr",&local_28,&local_38);
          if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
            testing::Message::Message((Message *)&local_68);
            if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)&(local_50.px)->mVal;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                       ,0x151,pcVar4);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_58);
            if (local_68.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_68.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50.px,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          testing::internal::CmpHelperGT<shared_ptr<Struct>,shared_ptr<Struct>>
                    ((internal *)&local_50,"yPtr","xPtr",&local_38,&local_28);
          if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
            testing::Message::Message((Message *)&local_68);
            if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)&(local_50.px)->mVal;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                       ,0x152,pcVar4);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_58);
            if (local_68.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_68.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50.px,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          testing::internal::CmpHelperGE<shared_ptr<Struct>,shared_ptr<Struct>>
                    ((internal *)&local_50,"yPtr","xPtr",&local_38,&local_28);
          if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
            testing::Message::Message((Message *)&local_68);
            if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)&(local_50.px)->mVal;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                       ,0x153,pcVar4);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_58);
            if (local_68.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_68.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50.px,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::CmpHelperGT<shared_ptr<Struct>,shared_ptr<Struct>>
                    ((internal *)&local_50,"xPtr","yPtr",&local_28,&local_38);
          if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
            testing::Message::Message((Message *)&local_68);
            if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)&(local_50.px)->mVal;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                       ,0x157,pcVar4);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_58);
            if (local_68.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_68.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50.px,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          testing::internal::CmpHelperGE<shared_ptr<Struct>,shared_ptr<Struct>>
                    ((internal *)&local_50,"xPtr","yPtr",&local_28,&local_38);
          if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
            testing::Message::Message((Message *)&local_68);
            if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)&(local_50.px)->mVal;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                       ,0x158,pcVar4);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_58);
            if (local_68.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_68.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50.px,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          testing::internal::CmpHelperLT<shared_ptr<Struct>,shared_ptr<Struct>>
                    ((internal *)&local_50,"yPtr","xPtr",&local_38,&local_28);
          if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
            testing::Message::Message((Message *)&local_68);
            if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)&(local_50.px)->mVal;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                       ,0x159,pcVar4);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_58);
            if (local_68.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_68.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50.px,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          testing::internal::CmpHelperLE<shared_ptr<Struct>,shared_ptr<Struct>>
                    ((internal *)&local_50,"yPtr","xPtr",&local_38,&local_28);
          if ((char)local_50.super_shared_ptr_base.pn.pn == '\0') {
            testing::Message::Message((Message *)&local_68);
            if ((AssertHelperData *)local_50.px == (AssertHelperData *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)&(local_50.px)->mVal;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                       ,0x15a,pcVar4);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_58);
            if (local_68.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_68.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50.px,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        shared_ptr<Struct>::shared_ptr(&local_50,&local_28);
        local_58.data_ = (AssertHelperData *)local_50.px;
        testing::internal::CmpHelperEQ<Struct*,Struct*>
                  ((internal *)&local_68,"pX","pZ",(Struct **)&local_40,(Struct **)&local_58);
        if (local_68.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_70);
          if (local_60.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_60.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                     ,0x161,pcVar4);
          testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&AStack_78);
          if (local_70.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_70.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_70.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperEQ<shared_ptr<Struct>,shared_ptr<Struct>>
                  ((internal *)&local_68,"xPtr","zPtr",&local_28,&local_50);
        if (local_68.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_70);
          if (local_60.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_60.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                     ,0x162,pcVar4);
          testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&AStack_78);
          if (local_70.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_70.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_70.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperEQ<shared_ptr<Struct>,shared_ptr<Struct>>
                  ((internal *)&local_68,"zPtr","xPtr",&local_50,&local_28);
        if (local_68.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_70);
          if (local_60.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_60.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                     ,0x163,pcVar4);
          testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&AStack_78);
          if (local_70.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_70.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_70.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperGE<shared_ptr<Struct>,shared_ptr<Struct>>
                  ((internal *)&local_68,"xPtr","zPtr",&local_28,&local_50);
        if (local_68.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_70);
          if (local_60.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_60.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                     ,0x164,pcVar4);
          testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&AStack_78);
          if (local_70.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_70.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_70.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperLE<shared_ptr<Struct>,shared_ptr<Struct>>
                  ((internal *)&local_68,"xPtr","zPtr",&local_28,&local_50);
        if (local_68.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_70);
          if (local_60.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_60.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                     ,0x165,pcVar4);
          testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&AStack_78);
          if (local_70.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_70.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_70.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        shared_ptr_count::release<Struct>((shared_ptr_count *)&local_50,local_50.px);
        shared_ptr_count::release<Struct>((shared_ptr_count *)&local_38,local_38.px);
        shared_ptr_count::release<Struct>((shared_ptr_count *)&local_28,local_28.px);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          return;
        }
        __stack_chk_fail();
      }
    }
  }
  __assert_fail("__null != px",
                "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/include/shared_ptr.hpp"
                ,0xd9,"T *shared_ptr<Struct>::operator->() const [T = Struct]");
}

Assistant:

TEST(shared_ptr, compare_ptr)
{
    // Create a shared_ptr
    shared_ptr<Struct> xPtr(new Struct(123));

    EXPECT_EQ(true, xPtr);
    EXPECT_EQ(true, xPtr.unique());
    EXPECT_EQ(1, xPtr.use_count());
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,xPtr->mVal);
    EXPECT_EQ(1, Struct::_mNbInstances);
    Struct* pX = xPtr.get();

    // Create another shared_ptr
    shared_ptr<Struct> yPtr(new Struct(234));

    EXPECT_EQ(true, xPtr);
    EXPECT_EQ(true, xPtr.unique());
    EXPECT_EQ(1, xPtr.use_count());
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,xPtr->mVal);
    EXPECT_EQ(2, Struct::_mNbInstances);

    EXPECT_EQ(true, yPtr);
    EXPECT_EQ(true, yPtr.unique());
    EXPECT_EQ(1, yPtr.use_count());
    EXPECT_NE((void*)NULL, yPtr.get());
    EXPECT_EQ(234, yPtr->mVal);
    Struct* pY = yPtr.get();

    EXPECT_NE(xPtr, yPtr);
    if (pX < pY)
    {
        EXPECT_LT(xPtr, yPtr);
        EXPECT_LE(xPtr, yPtr);
        EXPECT_GT(yPtr, xPtr);
        EXPECT_GE(yPtr, xPtr);
    }
    else // (pX > pY)
    {
        EXPECT_GT(xPtr, yPtr);
        EXPECT_GE(xPtr, yPtr);
        EXPECT_LT(yPtr, xPtr);
        EXPECT_LE(yPtr, xPtr);
    }

    // Copy a shared_ptr
    shared_ptr<Struct> zPtr = xPtr;
    Struct* pZ = zPtr.get();

    EXPECT_EQ(pX, pZ);
    EXPECT_EQ(xPtr, zPtr);
    EXPECT_EQ(zPtr, xPtr);
    EXPECT_GE(xPtr, zPtr);
    EXPECT_LE(xPtr, zPtr);
}